

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O1

void prng_seed_begin(prng *pr)

{
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var1;
  long *plVar2;
  
  if (pr[2].savesize == 0) {
    p_Var1 = pr[1].binarysink_[0].write;
    if (p_Var1 == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0) {
      plVar2 = (long *)(**(code **)pr[1].savesize)();
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))(plVar2);
      }
      pr[2].savesize = (size_t)plVar2;
    }
    else {
      pr[2].savesize = (size_t)p_Var1;
      pr[1].binarysink_[0].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
    }
    BinarySink_put_byte(*(BinarySink **)(pr[2].savesize + 8),'R');
    return;
  }
  __assert_fail("!pi->keymaker",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                0x92,"void prng_seed_begin(prng *)");
}

Assistant:

void prng_seed_begin(prng *pr)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);

    assert(!pi->keymaker);

    prngdebug("prng: reseed begin\n");

    /*
     * Make a hash instance that will generate the key for the new one.
     */
    if (pi->generator) {
        pi->keymaker = pi->generator;
        pi->generator = NULL;
    } else {
        pi->keymaker = ssh_hash_new(pi->hashalg);
    }

    put_byte(pi->keymaker, 'R');
}